

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkPartitionedSat
              (Abc_Ntk_t *pNtk,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  int RetValue;
  Aig_Man_t *pMan;
  int fAlignPol_local;
  int nConfTotal_local;
  int nConfPart_local;
  int nPartSize_local;
  int nAlgo_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x730,"int Abc_NtkPartitionedSat(Abc_Ntk_t *, int, int, int, int, int, int, int)"
                 );
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 == 0) {
    p = Abc_NtkToDar(pNtk,0,0);
    iVar1 = Aig_ManPartitionedSat
                      (p,nAlgo,nPartSize,nConfPart,nConfTotal,fAlignPol,fSynthesize,fVerbose);
    pNtk->pModel = (int *)p->pData;
    p->pData = (void *)0x0;
    Aig_ManStop(p);
    return iVar1;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                ,0x731,"int Abc_NtkPartitionedSat(Abc_Ntk_t *, int, int, int, int, int, int, int)");
}

Assistant:

int Abc_NtkPartitionedSat( Abc_Ntk_t * pNtk, int nAlgo, int nPartSize, int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    extern int Aig_ManPartitionedSat( Aig_Man_t * pNtk, int nAlgo, int nPartSize, int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose );
    Aig_Man_t * pMan;
    int RetValue;//, clk = Abc_Clock();
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    RetValue = Aig_ManPartitionedSat( pMan, nAlgo, nPartSize, nConfPart, nConfTotal, fAlignPol, fSynthesize, fVerbose ); 
    pNtk->pModel = (int *)pMan->pData, pMan->pData = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}